

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

void pulse_destroy(cubeb_conflict *ctx)

{
  if ((((ctx->input_collection_changed_callback ==
         (cubeb_device_collection_changed_callback_conflict)0x0) &&
       (ctx->input_collection_changed_user_ptr == (void *)0x0)) &&
      (ctx->output_collection_changed_callback ==
       (cubeb_device_collection_changed_callback_conflict)0x0)) &&
     (ctx->output_collection_changed_user_ptr == (void *)0x0)) {
    free(ctx->context_name);
    if (ctx->context != (pa_context *)0x0) {
      pulse_context_destroy(ctx);
    }
    if (ctx->mainloop != (pa_threaded_mainloop *)0x0) {
      (*cubeb_pa_threaded_mainloop_stop)(ctx->mainloop);
      (*cubeb_pa_threaded_mainloop_free)(ctx->mainloop);
    }
    if (ctx->device_ids != (cubeb_strings *)0x0) {
      cubeb_strings_destroy(ctx->device_ids);
    }
    if (ctx->libpulse != (void *)0x0) {
      dlclose();
    }
    free(ctx->default_sink_info);
    free(ctx);
    return;
  }
  __assert_fail("!ctx->input_collection_changed_callback && !ctx->input_collection_changed_user_ptr && !ctx->output_collection_changed_callback && !ctx->output_collection_changed_user_ptr"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                ,0x319,"void pulse_destroy(cubeb *)");
}

Assistant:

static void
pulse_destroy(cubeb * ctx)
{
  assert(!ctx->input_collection_changed_callback &&
         !ctx->input_collection_changed_user_ptr &&
         !ctx->output_collection_changed_callback &&
         !ctx->output_collection_changed_user_ptr);
  free(ctx->context_name);
  if (ctx->context) {
    pulse_context_destroy(ctx);
  }

  if (ctx->mainloop) {
    WRAP(pa_threaded_mainloop_stop)(ctx->mainloop);
    WRAP(pa_threaded_mainloop_free)(ctx->mainloop);
  }

  if (ctx->device_ids) {
    cubeb_strings_destroy(ctx->device_ids);
  }
#ifndef DISABLE_LIBPULSE_DLOPEN
  if (ctx->libpulse) {
    dlclose(ctx->libpulse);
  }
#endif
  free(ctx->default_sink_info);
  free(ctx);
}